

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TransformFeedback::RandomCase::init(RandomCase *this,EVP_PKEY_CTX *ctx)

{
  pointer __x;
  pointer pVVar1;
  pointer pcVar2;
  bool bVar3;
  _Alloc_hider name_00;
  undefined4 dataType;
  deUint32 dVar4;
  DataType DVar5;
  int iVar6;
  uint uVar7;
  int extraout_EAX;
  long lVar8;
  long *plVar9;
  undefined8 *puVar10;
  Interpolation IVar11;
  size_type *psVar12;
  ulong uVar13;
  anon_struct_8_2_bfd9d0cb_for_basic aVar14;
  int iVar15;
  anon_struct_8_2_bfd9d0cb_for_basic ctx_00;
  VarType *this_00;
  ulong uVar16;
  int iVar17;
  float fVar18;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tfCandidates;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Random rnd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tfVaryings;
  VarType local_2a0;
  undefined8 uStack_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  ulong local_260;
  Interpolation local_254;
  Interpolation local_250;
  deUint32 local_24c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  ProgramSpec *local_230;
  ulong *local_228;
  long local_220;
  ulong local_218 [2];
  int local_204;
  float local_200;
  float local_1fc;
  int local_1f8;
  float local_1f4;
  deRandom local_1f0;
  TransformFeedbackCase *local_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  ulong local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_24c = (this->super_TransformFeedbackCase).m_bufferMode;
  local_204 = 0x10;
  if (local_24c == 0x8c8d) {
    local_204 = 4;
  }
  deRandom_init(&local_1f0,*(deUint32 *)&(this->super_TransformFeedbackCase).field_0x144);
  local_1fc = deRandom_getFloat(&local_1f0);
  local_200 = deRandom_getFloat(&local_1f0);
  bVar3 = local_200 < 0.1;
  dVar4 = deRandom_getUint32(&local_1f0);
  local_1b8 = (ulong)dVar4 % (ulong)(bVar3 ^ 0xf);
  local_1f8 = (int)local_1b8 + 1;
  local_230 = &(this->super_TransformFeedbackCase).m_progSpec;
  iVar15 = 0;
  uVar16 = 0;
  local_1e0 = &this->super_TransformFeedbackCase;
  do {
    iVar17 = local_1f8 - iVar15;
    if (local_24c == 0x8c8d) {
      if (1 < iVar17) {
        iVar17 = 2;
      }
      lVar8 = 0xd;
LAB_00553459:
      if (iVar17 < 2) {
        lVar8 = 0xc;
      }
    }
    else {
      lVar8 = 0x15;
      if (iVar17 < 4) {
        lVar8 = 0xf;
        if (iVar17 != 3) goto LAB_00553459;
        lVar8 = 0x12;
        iVar17 = 3;
      }
    }
    local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
    local_260 = CONCAT44(local_260._4_4_,1);
    local_1b0 = uVar16;
    de::Random::choose<glu::DataType_const*,glu::DataType*>
              ((Random *)&local_1f0,init::typeCandidates,init::typeCandidates + lVar8,
               (DataType *)local_1a8,1);
    dataType = local_1a8._0_4_;
    local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
    de::Random::choose<glu::Precision_const*,glu::Precision*>
              ((Random *)&local_1f0,init::precisions,init::interpModes,(Precision *)local_1a8,1);
    local_250 = local_1a8._0_4_;
    DVar5 = glu::getDataTypeScalarType(dataType);
    IVar11 = INTERPOLATION_FLAT;
    if (DVar5 == TYPE_FLOAT) {
      local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
      de::Random::
      choose<deqp::gles3::Functional::TransformFeedback::Interpolation_const*,deqp::gles3::Functional::TransformFeedback::Interpolation*>
                ((Random *)&local_1f0,init::interpModes,(Interpolation *)"ubo",
                 (Interpolation *)local_1a8,1);
      IVar11 = local_1a8._0_4_;
    }
    local_254 = IVar11;
    if (dataType - 5 < 9 || dataType - 0x12 < 9) {
      iVar6 = glu::getDataTypeMatrixNumColumns(dataType);
      local_260 = CONCAT44(local_260._4_4_,iVar6);
    }
    iVar6 = glu::getDataTypeScalarSize(dataType);
    uVar16 = local_1b0;
    if (local_24c == 0x8c8d) {
      uVar7 = (uint)(4 / (long)iVar6);
    }
    else {
      uVar7 = iVar17 / (int)local_260;
    }
    local_1f4 = deRandom_getFloat(&local_1f0);
    iVar17 = 1;
    if (local_1f4 < 0.3) {
      if ((int)uVar7 < 2) {
        uVar7 = 1;
      }
      dVar4 = deRandom_getUint32(&local_1f0);
      iVar17 = dVar4 % uVar7 + 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    uVar7 = (uint)uVar16;
    std::ostream::operator<<((ostringstream *)local_1a8,uVar7);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0xaf06a5);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_280.field_2._M_allocated_capacity = *psVar12;
      local_280.field_2._8_8_ = plVar9[3];
    }
    else {
      local_280.field_2._M_allocated_capacity = *psVar12;
      local_280._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_280._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if (local_2a0._0_8_ != (long)&local_2a0 + 0x10U) {
      operator_delete((void *)local_2a0._0_8_,local_2a0.m_data._8_8_ + 1);
    }
    name_00._M_p = local_280._M_dataplus._M_p;
    if (0.3 <= local_1f4) {
      this_00 = (VarType *)local_1a8;
      glu::VarType::VarType(this_00,dataType,local_250);
      ProgramSpec::addVarying(local_230,name_00._M_p,this_00,local_254);
    }
    else {
      glu::VarType::VarType(&local_2a0,dataType,local_250);
      glu::VarType::VarType((VarType *)local_1a8,&local_2a0,iVar17);
      ProgramSpec::addVarying(local_230,name_00._M_p,(VarType *)local_1a8,local_254);
      glu::VarType::~VarType((VarType *)local_1a8);
      this_00 = &local_2a0;
    }
    glu::VarType::~VarType(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    iVar15 = iVar15 + iVar17 * (int)local_260;
    uVar16 = (ulong)(uVar7 + 1);
    if ((int)local_1b8 < iVar15) {
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_1fc < 0.7) {
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"gl_Position","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
      }
      if (local_200 < 0.1) {
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"gl_PointSize","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
      }
      if (uVar7 < 0x7fffffff) {
        uVar13 = 0;
        local_260 = uVar16;
        do {
          pVVar1 = (local_1e0->m_progSpec).m_varyings.
                   super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __x = pVVar1 + uVar13;
          if (pVVar1[uVar13].type.m_type == TYPE_ARRAY) {
            fVar18 = deRandom_getFloat(&local_1f0);
            if (0.5 <= fVar18) {
              iVar15 = (__x->type).m_data.array.size;
              if (0 < iVar15) {
                iVar17 = 0;
                do {
                  local_228 = local_218;
                  pcVar2 = (__x->name)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_228,pcVar2,pcVar2 + (__x->name)._M_string_length);
                  std::__cxx11::string::append((char *)&local_228);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::ostream::operator<<((ostringstream *)local_1a8,iVar17);
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base(local_138);
                  uVar16 = 0xf;
                  if (local_228 != local_218) {
                    uVar16 = local_218[0];
                  }
                  if (uVar16 < (ulong)(local_1d0 + local_220)) {
                    uVar16 = 0xf;
                    if (local_1d8 != local_1c8) {
                      uVar16 = local_1c8[0];
                    }
                    if (uVar16 < (ulong)(local_1d0 + local_220)) goto LAB_005539d7;
                    puVar10 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_228);
                  }
                  else {
LAB_005539d7:
                    puVar10 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1d8);
                  }
                  local_2a0._0_8_ = (long)&local_2a0 + 0x10;
                  plVar9 = puVar10 + 2;
                  if ((long *)*puVar10 == plVar9) {
                    local_2a0.m_data._8_8_ = *plVar9;
                    uStack_288 = puVar10[3];
                  }
                  else {
                    local_2a0.m_data._8_8_ = *plVar9;
                    local_2a0._0_8_ = (long *)*puVar10;
                  }
                  local_2a0.m_data.basic = *(anon_struct_8_2_bfd9d0cb_for_basic *)(puVar10 + 1);
                  *puVar10 = plVar9;
                  puVar10[1] = 0;
                  *(undefined1 *)plVar9 = 0;
                  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2a0);
                  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
                  psVar12 = (size_type *)(plVar9 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar9 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar12) {
                    local_280.field_2._M_allocated_capacity = *psVar12;
                    local_280.field_2._8_8_ = plVar9[3];
                  }
                  else {
                    local_280.field_2._M_allocated_capacity = *psVar12;
                    local_280._M_dataplus._M_p = (pointer)*plVar9;
                  }
                  local_280._M_string_length = plVar9[1];
                  *plVar9 = (long)psVar12;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_248,&local_280);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_280._M_dataplus._M_p != &local_280.field_2) {
                    operator_delete(local_280._M_dataplus._M_p,
                                    local_280.field_2._M_allocated_capacity + 1);
                  }
                  if (local_2a0._0_8_ != (long)&local_2a0 + 0x10U) {
                    operator_delete((void *)local_2a0._0_8_,local_2a0.m_data._8_8_ + 1);
                  }
                  if (local_1d8 != local_1c8) {
                    operator_delete(local_1d8,local_1c8[0] + 1);
                  }
                  if (local_228 != local_218) {
                    operator_delete(local_228,local_218[0] + 1);
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar15 != iVar17);
              }
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_248,&__x->name);
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_248,&__x->name);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != local_260);
      }
      iVar17 = (int)((ulong)((long)local_248.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_248.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
      iVar15 = local_204;
      if (iVar17 < local_204) {
        iVar15 = iVar17;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a8,(long)iVar15,(allocator_type *)&local_280);
      de::Random::
      choose<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((Random *)&local_1f0,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_248.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_248.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_1a8._0_8_,(int)((ulong)(local_1a8._8_8_ - local_1a8._0_8_) >> 5));
      ctx_00 = (anon_struct_8_2_bfd9d0cb_for_basic)local_1a8._0_8_;
      de::Random::
      shuffle<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((Random *)&local_1f0,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_1a8._0_8_,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_1a8._8_8_);
      for (aVar14 = (anon_struct_8_2_bfd9d0cb_for_basic)local_1a8._0_8_;
          aVar14 != (anon_struct_8_2_bfd9d0cb_for_basic)local_1a8._8_8_;
          aVar14 = (anon_struct_8_2_bfd9d0cb_for_basic)((long)aVar14 + 0x20)) {
        ctx_00 = *(anon_struct_8_2_bfd9d0cb_for_basic *)aVar14;
        ProgramSpec::addTransformFeedbackVarying(local_230,(char *)ctx_00);
      }
      TransformFeedbackCase::init(local_1e0,(EVP_PKEY_CTX *)ctx_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_248);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void init (void)
	{
		// \note Hard-coded indices and hackery are used when indexing this, beware.
		static const glu::DataType typeCandidates[] =
		{
			glu::TYPE_FLOAT,
			glu::TYPE_FLOAT_VEC2,
			glu::TYPE_FLOAT_VEC3,
			glu::TYPE_FLOAT_VEC4,
			glu::TYPE_INT,
			glu::TYPE_INT_VEC2,
			glu::TYPE_INT_VEC3,
			glu::TYPE_INT_VEC4,
			glu::TYPE_UINT,
			glu::TYPE_UINT_VEC2,
			glu::TYPE_UINT_VEC3,
			glu::TYPE_UINT_VEC4,

			glu::TYPE_FLOAT_MAT2,
			glu::TYPE_FLOAT_MAT2X3,
			glu::TYPE_FLOAT_MAT2X4,

			glu::TYPE_FLOAT_MAT3X2,
			glu::TYPE_FLOAT_MAT3,
			glu::TYPE_FLOAT_MAT3X4,

			glu::TYPE_FLOAT_MAT4X2,
			glu::TYPE_FLOAT_MAT4X3,
			glu::TYPE_FLOAT_MAT4
		};

		static const glu::Precision precisions[] =
		{
			glu::PRECISION_LOWP,
			glu::PRECISION_MEDIUMP,
			glu::PRECISION_HIGHP
		};

		static const Interpolation interpModes[] =
		{
			INTERPOLATION_FLAT,
			INTERPOLATION_SMOOTH,
			INTERPOLATION_CENTROID
		};

		const int	maxAttributeVectors					= 16;
//		const int	maxTransformFeedbackComponents		= 64; // \note It is enough to limit attribute set size.
		bool		isSeparateMode						= m_bufferMode == GL_SEPARATE_ATTRIBS;
		int			maxTransformFeedbackVars			= isSeparateMode ? 4 : maxAttributeVectors;
		const float	arrayWeight							= 0.3f;
		const float	positionWeight						= 0.7f;
		const float	pointSizeWeight						= 0.1f;
		const float	captureFullArrayWeight				= 0.5f;

		de::Random	rnd									(m_seed);
		bool		usePosition							= rnd.getFloat() < positionWeight;
		bool		usePointSize						= rnd.getFloat() < pointSizeWeight;
		int			numAttribVectorsToUse				= rnd.getInt(1, maxAttributeVectors - 1/*position*/ - (usePointSize ? 1 : 0));

		int			numAttributeVectors					= 0;
		int			varNdx								= 0;

		// Generate varyings.
		while (numAttributeVectors < numAttribVectorsToUse)
		{
			int						maxVecs		= isSeparateMode ? de::min(2 /*at most 2*mat2*/, numAttribVectorsToUse-numAttributeVectors) : numAttribVectorsToUse-numAttributeVectors;
			const glu::DataType*	begin		= &typeCandidates[0];
			const glu::DataType*	end			= begin + (maxVecs >= 4 ? 21 :
														   maxVecs >= 3 ? 18 :
														   maxVecs >= 2 ? (isSeparateMode ? 13 : 15) : 12);

			glu::DataType			type		= rnd.choose<glu::DataType>(begin, end);
			glu::Precision			precision	= rnd.choose<glu::Precision>(&precisions[0], &precisions[0]+DE_LENGTH_OF_ARRAY(precisions));
			Interpolation			interp		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT
												? rnd.choose<Interpolation>(&interpModes[0], &interpModes[0]+DE_LENGTH_OF_ARRAY(interpModes))
												: INTERPOLATION_FLAT;
			int						numVecs		= glu::isDataTypeMatrix(type) ? glu::getDataTypeMatrixNumColumns(type) : 1;
			int						numComps	= glu::getDataTypeScalarSize(type);
			int						maxArrayLen	= de::max(1, isSeparateMode ? 4/numComps : maxVecs/numVecs);
			bool					useArray	= rnd.getFloat() < arrayWeight;
			int						arrayLen	= useArray ? rnd.getInt(1, maxArrayLen) : 1;
			std::string				name		= "v_var" + de::toString(varNdx);

			if (useArray)
				m_progSpec.addVarying(name.c_str(), glu::VarType(glu::VarType(type, precision), arrayLen), interp);
			else
				m_progSpec.addVarying(name.c_str(), glu::VarType(type, precision), interp);

			numAttributeVectors	+= arrayLen*numVecs;
			varNdx				+= 1;
		}

		// Generate transform feedback candidate set.
		vector<string> tfCandidates;

		if (usePosition)	tfCandidates.push_back("gl_Position");
		if (usePointSize)	tfCandidates.push_back("gl_PointSize");

		for (int ndx = 0; ndx < varNdx /* num varyings */; ndx++)
		{
			const Varying& var = m_progSpec.getVaryings()[ndx];

			if (var.type.isArrayType())
			{
				const bool captureFull = rnd.getFloat() < captureFullArrayWeight;

				if (captureFull)
					tfCandidates.push_back(var.name);
				else
				{
					const int numElem = var.type.getArraySize();
					for (int elemNdx = 0; elemNdx < numElem; elemNdx++)
						tfCandidates.push_back(var.name + "[" + de::toString(elemNdx) + "]");
				}
			}
			else
				tfCandidates.push_back(var.name);
		}

		// Pick random selection.
		vector<string> tfVaryings(de::min((int)tfCandidates.size(), maxTransformFeedbackVars));
		rnd.choose(tfCandidates.begin(), tfCandidates.end(), tfVaryings.begin(), (int)tfVaryings.size());
		rnd.shuffle(tfVaryings.begin(), tfVaryings.end());

		for (vector<string>::const_iterator var = tfVaryings.begin(); var != tfVaryings.end(); var++)
			m_progSpec.addTransformFeedbackVarying(var->c_str());

		TransformFeedbackCase::init();
	}